

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

MIR_item_t_conflict add_item(MIR_context_t ctx,MIR_item_t_conflict item)

{
  MIR_item_type_t MVar1;
  MIR_error_type_t MVar2;
  MIR_item_t_conflict pMVar3;
  MIR_item_type_t MVar4;
  char *pcVar5;
  MIR_item_t_conflict pMVar6;
  MIR_func_t pMVar7;
  MIR_context_t ctx_00;
  MIR_item_t_conflict item_local;
  
  item_local = item;
  pcVar5 = MIR_item_name(ctx,item);
  ctx_00 = ctx;
  pMVar6 = item_tab_find(ctx,pcVar5,item->module);
  if (pMVar6 == (MIR_item_t_conflict)0x0) {
    DLIST_MIR_item_t_append(&ctx->curr_module->items,item);
    HTAB_MIR_item_t_do(ctx->module_item_tab,item,HTAB_INSERT,&item_local);
    return item_local;
  }
  MVar4 = pMVar6->item_type;
  switch(MVar4) {
  case MIR_func_item:
  case MIR_data_item:
  case MIR_ref_data_item:
  case MIR_lref_data_item:
  case MIR_expr_data_item:
  case MIR_bss_item:
    MVar4 = item->item_type;
    if (MVar4 == MIR_export_item) {
      if (pMVar6->export_p != '\0') {
        return pMVar6;
      }
      pMVar6->export_p = '\x01';
LAB_0011064a:
      DLIST_MIR_item_t_append(&ctx->curr_module->items,item);
      item->ref_def = pMVar6;
      return item;
    }
    if (MVar4 == MIR_forward_item) goto LAB_0011064a;
    if (MVar4 == MIR_import_item) {
      pMVar7 = (item->u).func;
      pcVar5 = "import of local definition %s";
      goto LAB_0011079b;
    }
    ctx = (MIR_context_t)ctx->error_func;
    pcVar5 = MIR_item_name(ctx_00,item);
    (*(code *)ctx)(0x10,"Repeated item declaration %s",pcVar5);
  case MIR_proto_item:
    pcVar5 = "item %s was already defined as proto";
    pMVar7 = (MIR_func_t)((pMVar6->u).func)->name;
    MVar2 = MIR_repeated_decl_error;
    break;
  case MIR_import_item:
    if (item->item_type == MIR_import_item) {
      return pMVar6;
    }
    pMVar7 = (pMVar6->u).func;
    pcVar5 = "existing module definition %s already defined as import";
    goto LAB_0011079b;
  case MIR_export_item:
  case MIR_forward_item:
    MVar1 = item->item_type;
    if (MVar1 - MIR_export_item < 2) {
      pMVar3 = pMVar6;
      if (MVar4 != MVar1) {
        DLIST_MIR_item_t_append(&ctx->curr_module->items,item);
        MVar4 = item->item_type;
        pMVar3 = item;
      }
      item = pMVar3;
      if (MVar4 != MIR_export_item) {
        return item;
      }
      if (pMVar6->item_type != MIR_forward_item) {
        return item;
      }
      pMVar6->ref_def = item;
LAB_001106e9:
      item_tab_remove(ctx,pMVar6);
      pMVar6 = item_tab_insert(ctx,item);
      if (item == pMVar6) {
        return item;
      }
      __assert_fail("item == tab_item",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0x3f4,"MIR_item_t add_item(MIR_context_t, MIR_item_t)");
    }
    if (MVar1 != MIR_import_item) {
      DLIST_MIR_item_t_append(&ctx->curr_module->items,item);
      pMVar6->ref_def = item;
      if (pMVar6->item_type == MIR_export_item) {
        item->export_p = '\x01';
      }
      goto LAB_001106e9;
    }
    pMVar7 = (item->u).func;
    pcVar5 = "export/forward of import %s";
LAB_0011079b:
    MVar2 = MIR_import_export_error;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x414,"MIR_item_t add_item(MIR_context_t, MIR_item_t)");
  }
  (*ctx->error_func)(MVar2,pcVar5,pMVar7);
  if ((uint)pcVar5 < 0xc) {
    return *(MIR_item_t_conflict *)(&DAT_001799d0 + ((ulong)pcVar5 & 0xffffffff) * 8);
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                ,0x477,"size_t _MIR_type_size(MIR_context_t, MIR_type_t)");
}

Assistant:

static MIR_item_t add_item (MIR_context_t ctx, MIR_item_t item) {
  int replace_p;
  MIR_item_t tab_item;

  if ((tab_item = item_tab_find (ctx, MIR_item_name (ctx, item), item->module)) == NULL) {
    DLIST_APPEND (MIR_item_t, curr_module->items, item);
    HTAB_DO (MIR_item_t, module_item_tab, item, HTAB_INSERT, item);
    return item;
  }
  switch (tab_item->item_type) {
  case MIR_import_item:
    if (item->item_type != MIR_import_item)
      MIR_get_error_func (ctx) (MIR_import_export_error,
                                "existing module definition %s already defined as import",
                                tab_item->u.import_id);
    item = tab_item;
    break;
  case MIR_export_item:
  case MIR_forward_item:
    replace_p = FALSE;
    if (item->item_type == MIR_import_item) {
      MIR_get_error_func (ctx) (MIR_import_export_error, "export/forward of import %s",
                                item->u.import_id);
    } else if (item->item_type != MIR_export_item && item->item_type != MIR_forward_item) {
      replace_p = TRUE;
      DLIST_APPEND (MIR_item_t, curr_module->items, item);
    } else {
      if (tab_item->item_type == item->item_type)
        item = tab_item;
      else
        DLIST_APPEND (MIR_item_t, curr_module->items, item);
      if (item->item_type == MIR_export_item && tab_item->item_type == MIR_forward_item)
        replace_p = TRUE;
    }
    if (replace_p) { /* replace forward by export or export/forward by its definition: */
      tab_item->ref_def = item;
      if (tab_item->item_type == MIR_export_item) item->export_p = TRUE;
      item_tab_remove (ctx, tab_item);
      tab_item = item_tab_insert (ctx, item);
      mir_assert (item == tab_item);
    }
    break;
  case MIR_proto_item:
    MIR_get_error_func (ctx) (MIR_repeated_decl_error, "item %s was already defined as proto",
                              tab_item->u.proto->name);
    break;
  case MIR_bss_item:
  case MIR_data_item:
  case MIR_ref_data_item:
  case MIR_lref_data_item:
  case MIR_expr_data_item:
  case MIR_func_item:
    if (item->item_type == MIR_export_item) {
      if (tab_item->export_p) {
        item = tab_item;
      } else { /* just keep one export: */
        tab_item->export_p = TRUE;
        DLIST_APPEND (MIR_item_t, curr_module->items, item);
        item->ref_def = tab_item;
      }
    } else if (item->item_type == MIR_forward_item) {
      DLIST_APPEND (MIR_item_t, curr_module->items, item);
      item->ref_def = tab_item;
    } else if (item->item_type == MIR_import_item) {
      MIR_get_error_func (ctx) (MIR_import_export_error, "import of local definition %s",
                                item->u.import_id);
    } else {
      MIR_get_error_func (ctx) (MIR_repeated_decl_error, "Repeated item declaration %s",
                                MIR_item_name (ctx, item));
    }
    break;
  default: mir_assert (FALSE);
  }
  return item;
}